

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

DataPageHeader * __thiscall
duckdb_parquet::DataPageHeader::operator=(DataPageHeader *this,DataPageHeader *other63)

{
  type tVar1;
  type tVar2;
  type tVar3;
  
  tVar1 = other63->encoding;
  tVar2 = other63->definition_level_encoding;
  tVar3 = other63->repetition_level_encoding;
  this->num_values = other63->num_values;
  this->encoding = tVar1;
  this->definition_level_encoding = tVar2;
  this->repetition_level_encoding = tVar3;
  Statistics::operator=(&this->statistics,&other63->statistics);
  this->__isset = other63->__isset;
  return this;
}

Assistant:

DataPageHeader& DataPageHeader::operator=(const DataPageHeader& other63) {
  num_values = other63.num_values;
  encoding = other63.encoding;
  definition_level_encoding = other63.definition_level_encoding;
  repetition_level_encoding = other63.repetition_level_encoding;
  statistics = other63.statistics;
  __isset = other63.__isset;
  return *this;
}